

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O2

int wally_sha512(uchar *bytes,size_t bytes_len,uchar *bytes_out,size_t len)

{
  if ((len != 0x40 || bytes_out == (uchar *)0x0) || bytes_len != 0 && bytes == (uchar *)0x0) {
    return -2;
  }
  sha512((sha512 *)bytes_out,bytes,bytes_len);
  return 0;
}

Assistant:

int wally_sha512(const unsigned char *bytes, size_t bytes_len,
                 unsigned char *bytes_out, size_t len)
{
    struct sha512 sha;
    bool aligned = alignment_ok(bytes_out, sizeof(sha.u.u64));

    if ((!bytes && bytes_len != 0) || !bytes_out || len != SHA512_LEN)
        return WALLY_EINVAL;

    sha512(aligned ? (struct sha512 *)bytes_out : &sha, bytes, bytes_len);
    if (!aligned) {
        memcpy(bytes_out, &sha, sizeof(sha));
        wally_clear(&sha, sizeof(sha));
    }
    return WALLY_OK;
}